

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall cmCPackIFWPackage::ConfigureFromPrefix(cmCPackIFWPackage *this,string *prefix)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  string *psVar4;
  pair<std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>,_bool> pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string *local_420;
  cmValue local_418;
  cmValue value_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  undefined1 local_3d0 [8];
  string lowerValue;
  cmValue value_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  _Base_ptr local_368;
  undefined1 local_360;
  mapped_type *local_358;
  mapped_type *local_350;
  DependenceStruct *depRef_1;
  mapped_type *pmStack_340;
  bool hasDep_1;
  cmCPackIFWPackage *depPkg_1;
  DependenceStruct dep_1;
  string *d_1;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  iterator local_2a8;
  size_type local_2a0;
  undefined1 local_298 [8];
  cmList depsOn;
  cmValue value_8;
  mapped_type *local_248;
  mapped_type *local_240;
  DependenceStruct *depRef;
  mapped_type *pmStack_230;
  bool hasDep;
  cmCPackIFWPackage *depPkg;
  DependenceStruct dep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  cmValue local_1b0;
  cmValue value_7;
  cmValue local_180;
  cmValue value_6;
  undefined1 local_158 [8];
  cmList deps;
  cmValue local_138;
  cmValue value_5;
  cmValue local_110;
  cmValue value_4;
  cmValue local_e8;
  cmValue value_3;
  cmValue local_c0;
  cmValue value_2;
  cmValue local_98;
  cmValue value_1;
  cmValue local_70;
  cmValue value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string option;
  string *prefix_local;
  cmCPackIFWPackage *this_local;
  
  option.field_2._8_8_ = prefix;
  std::__cxx11::string::string((string *)local_38);
  std::operator+(&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DISPLAY_NAME");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->DisplayName);
  }
  else {
    local_70 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_70);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_70);
      cmCPackIFWCommon::ExpandListArgument(psVar4,&this->DisplayName);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DESCRIPTION");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_1);
  std::__cxx11::string::~string((string *)&value_1);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->Description);
  }
  else {
    local_98 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_98);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_98);
      cmCPackIFWCommon::ExpandListArgument(psVar4,&this->Description);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"RELEASE_DATE");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_2);
  std::__cxx11::string::~string((string *)&value_2);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    local_c0 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_c0);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_c0);
      std::__cxx11::string::operator=((string *)&this->ReleaseDate,(string *)psVar4);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"SORTING_PRIORITY");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_3);
  std::__cxx11::string::~string((string *)&value_3);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    local_e8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_e8);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_e8);
      std::__cxx11::string::operator=((string *)&this->SortingPriority,(string *)psVar4);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"UPDATE_TEXT");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_4);
  std::__cxx11::string::~string((string *)&value_4);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    local_110 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_110);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_110);
      std::__cxx11::string::operator=((string *)&this->UpdateText,(string *)psVar4);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"TRANSLATIONS");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_5);
  std::__cxx11::string::~string((string *)&value_5);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Translations);
  }
  else {
    local_138 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_138);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Translations);
      deps.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_138.Value;
      cmExpandList(local_138,&this->Translations,No);
    }
  }
  cmList::cmList((cmList *)local_158);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DEPENDS");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_6);
  std::__cxx11::string::~string((string *)&value_6);
  local_180 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
  bVar1 = cmValue::operator_cast_to_bool(&local_180);
  if (bVar1) {
    cmList::assign((cmList *)local_158,local_180,Yes,No);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DEPENDENCIES");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_7);
  std::__cxx11::string::~string((string *)&value_7);
  local_1b0 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
  bVar1 = cmValue::operator_cast_to_bool(&local_1b0);
  if (bVar1) {
    cmList::append_abi_cxx11_((cmList *)local_158,local_1b0,Yes,No);
  }
  __end1 = cmList::begin_abi_cxx11_((cmList *)local_158);
  d = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      cmList::end_abi_cxx11_((cmList *)local_158);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&d), bVar1) {
    dep.Compare.Value.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    DependenceStruct::DependenceStruct
              ((DependenceStruct *)&depPkg,(string *)dep.Compare.Value.field_2._8_8_);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
            ::count(&((this->super_cmCPackIFWCommon).Generator)->Packages,(key_type *)&depPkg);
    if (sVar2 != 0) {
      pmStack_230 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                    ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,
                                 (key_type *)&depPkg);
      std::__cxx11::string::operator=((string *)&depPkg,(string *)&pmStack_230->Name);
    }
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
            ::count(&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                    (key_type *)&depPkg);
    depRef._7_1_ = sVar3 != 0;
    local_240 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                             (key_type *)&depPkg);
    if ((depRef._7_1_ & 1) == 0) {
      DependenceStruct::operator=(local_240,(DependenceStruct *)&depPkg);
    }
    local_248 = local_240;
    std::
    set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
    ::insert(&this->AlienDependencies,&local_248);
    DependenceStruct::~DependenceStruct((DependenceStruct *)&depPkg);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"AUTO_DEPEND_ON");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_8);
  std::__cxx11::string::~string((string *)&value_8);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::
    set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
    ::clear(&this->AlienAutoDependOn);
  }
  else {
    depsOn.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool
                      ((cmValue *)
                       &depsOn.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      psVar4 = cmValue::operator_cast_to_string_
                         ((cmValue *)
                          &depsOn.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::string((string *)&local_2c8,(string *)psVar4);
      local_2a8 = &local_2c8;
      local_2a0 = 1;
      init._M_len = 1;
      init._M_array = local_2a8;
      cmList::cmList((cmList *)local_298,init);
      local_5c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8;
      do {
        local_5c0 = local_5c0 + -1;
        std::__cxx11::string::~string((string *)local_5c0);
      } while (local_5c0 != &local_2c8);
      __end3 = cmList::begin_abi_cxx11_((cmList *)local_298);
      d_1 = (string *)cmList::end_abi_cxx11_((cmList *)local_298);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&d_1), bVar1) {
        dep_1.Compare.Value.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
        DependenceStruct::DependenceStruct
                  ((DependenceStruct *)&depPkg_1,(string *)dep_1.Compare.Value.field_2._8_8_);
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::count(&((this->super_cmCPackIFWCommon).Generator)->Packages,(key_type *)&depPkg_1)
        ;
        if (sVar2 != 0) {
          pmStack_340 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                        ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,
                                     (key_type *)&depPkg_1);
          std::__cxx11::string::operator=((string *)&depPkg_1,(string *)&pmStack_340->Name);
        }
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                ::count(&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                        (key_type *)&depPkg_1);
        depRef_1._7_1_ = sVar3 != 0;
        local_350 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                    ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                                 (key_type *)&depPkg_1);
        if ((depRef_1._7_1_ & 1) == 0) {
          DependenceStruct::operator=(local_350,(DependenceStruct *)&depPkg_1);
        }
        local_358 = local_350;
        pVar5 = std::
                set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
                ::insert(&this->AlienAutoDependOn,&local_358);
        local_368 = (_Base_ptr)pVar5.first._M_node;
        local_360 = pVar5.second;
        DependenceStruct::~DependenceStruct((DependenceStruct *)&depPkg_1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      cmList::~cmList((cmList *)local_298);
    }
  }
  std::operator+(&local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"VIRTUAL");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->Virtual,"true");
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DEFAULT");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_9);
  std::__cxx11::string::~string((string *)&value_9);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    lowerValue.field_2._8_8_ =
         cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&lowerValue.field_2 + 8));
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&lowerValue.field_2 + 8));
      cmsys::SystemTools::LowerCase((string *)local_3d0,psVar4);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3d0,"true");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->Default,"true");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3d0,"false");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&this->Default,"false");
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3d0,"script");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)&this->Default,"script");
          }
          else {
            psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&lowerValue.field_2 + 8));
            std::__cxx11::string::operator=((string *)&this->Default,(string *)psVar4);
          }
        }
      }
      std::__cxx11::string::~string((string *)local_3d0);
    }
  }
  std::operator+(&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"FORCED_INSTALLATION");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->ForcedInstallation,"true");
    }
    else {
      bVar1 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,(string *)local_38);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->ForcedInstallation,"false");
      }
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"REPLACES");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_10);
  std::__cxx11::string::~string((string *)&value_10);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Replaces);
  }
  else {
    local_418 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_418);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Replaces);
      local_420 = local_418.Value;
      cmExpandList(local_418,&this->Replaces,No);
    }
  }
  std::operator+(&local_440,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"REQUIRES_ADMIN_RIGHTS");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->RequiresAdminRights,"true");
    }
    else {
      bVar1 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,(string *)local_38);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->RequiresAdminRights,"false");
      }
    }
  }
  std::operator+(&local_460,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"CHECKABLE");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->Checkable,"true");
    }
    else {
      bVar1 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,(string *)local_38);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->Checkable,"false");
      }
    }
  }
  cmList::~cmList((cmList *)local_158);
  std::__cxx11::string::~string((string *)local_38);
  return 1;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromPrefix(const std::string& prefix)
{
  // Temporary variable for full option name
  std::string option;

  // Display name
  option = prefix + "DISPLAY_NAME";
  if (this->IsSetToEmpty(option)) {
    this->DisplayName.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmCPackIFWPackage::ExpandListArgument(*value, this->DisplayName);
  }

  // Description
  option = prefix + "DESCRIPTION";
  if (this->IsSetToEmpty(option)) {
    this->Description.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmCPackIFWPackage::ExpandListArgument(*value, this->Description);
  }

  // Release date
  option = prefix + "RELEASE_DATE";
  if (this->IsSetToEmpty(option)) {
    this->ReleaseDate.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->ReleaseDate = *value;
  }

  // Sorting priority
  option = prefix + "SORTING_PRIORITY";
  if (this->IsSetToEmpty(option)) {
    this->SortingPriority.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->SortingPriority = *value;
  }

  // Update text
  option = prefix + "UPDATE_TEXT";
  if (this->IsSetToEmpty(option)) {
    this->UpdateText.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->UpdateText = *value;
  }

  // Translations
  option = prefix + "TRANSLATIONS";
  if (this->IsSetToEmpty(option)) {
    this->Translations.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->Translations.clear();
    cmExpandList(value, this->Translations);
  }

  // QtIFW dependencies
  cmList deps;
  option = prefix + "DEPENDS";
  if (cmValue value = this->GetOption(option)) {
    deps.assign(value);
  }
  option = prefix + "DEPENDENCIES";
  if (cmValue value = this->GetOption(option)) {
    deps.append(value);
  }
  for (auto const& d : deps) {
    DependenceStruct dep(d);
    if (this->Generator->Packages.count(dep.Name)) {
      cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
      dep.Name = depPkg.Name;
    }
    bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
    DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
    if (!hasDep) {
      depRef = dep;
    }
    this->AlienDependencies.insert(&depRef);
  }

  // Automatic dependency on
  option = prefix + "AUTO_DEPEND_ON";
  if (this->IsSetToEmpty(option)) {
    this->AlienAutoDependOn.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmList depsOn{ value };
    for (std::string const& d : depsOn) {
      DependenceStruct dep(d);
      if (this->Generator->Packages.count(dep.Name)) {
        cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
        dep.Name = depPkg.Name;
      }
      bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
      DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
      if (!hasDep) {
        depRef = dep;
      }
      this->AlienAutoDependOn.insert(&depRef);
    }
  }

  // Visibility
  option = prefix + "VIRTUAL";
  if (this->IsSetToEmpty(option)) {
    this->Virtual.clear();
  } else if (this->IsOn(option)) {
    this->Virtual = "true";
  }

  // Default selection
  option = prefix + "DEFAULT";
  if (this->IsSetToEmpty(option)) {
    this->Default.clear();
  } else if (cmValue value = this->GetOption(option)) {
    std::string lowerValue = cmsys::SystemTools::LowerCase(*value);
    if (lowerValue == "true") {
      this->Default = "true";
    } else if (lowerValue == "false") {
      this->Default = "false";
    } else if (lowerValue == "script") {
      this->Default = "script";
    } else {
      this->Default = *value;
    }
  }

  // Forsed installation
  option = prefix + "FORCED_INSTALLATION";
  if (this->IsSetToEmpty(option)) {
    this->ForcedInstallation.clear();
  } else if (this->IsOn(option)) {
    this->ForcedInstallation = "true";
  } else if (this->IsSetToOff(option)) {
    this->ForcedInstallation = "false";
  }

  // Replaces
  option = prefix + "REPLACES";
  if (this->IsSetToEmpty(option)) {
    this->Replaces.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->Replaces.clear();
    cmExpandList(value, this->Replaces);
  }

  // Requires admin rights
  option = prefix + "REQUIRES_ADMIN_RIGHTS";
  if (this->IsSetToEmpty(option)) {
    this->RequiresAdminRights.clear();
  } else if (this->IsOn(option)) {
    this->RequiresAdminRights = "true";
  } else if (this->IsSetToOff(option)) {
    this->RequiresAdminRights = "false";
  }

  // Checkable
  option = prefix + "CHECKABLE";
  if (this->IsSetToEmpty(option)) {
    this->Checkable.clear();
  } else if (this->IsOn(option)) {
    this->Checkable = "true";
  } else if (this->IsSetToOff(option)) {
    this->Checkable = "false";
  }

  return 1;
}